

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

SRC_STATE * sinc_state_new(int converter_type,int channels,SRC_ERROR *error)

{
  SINC_FILTER *pSVar1;
  SRC_STATE *state;
  SRC_ERROR *error_local;
  int channels_local;
  int converter_type_local;
  
  if (((converter_type != 2) && (converter_type != 1)) && (converter_type != 0)) {
    __assert_fail("converter_type == SRC_SINC_FASTEST || converter_type == SRC_SINC_MEDIUM_QUALITY || converter_type == SRC_SINC_BEST_QUALITY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x109,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if (channels < 1) {
    __assert_fail("channels > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x10a,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if (error == (SRC_ERROR *)0x0) {
    __assert_fail("error != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x10b,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if (channels < 0x81) {
    _channels_local = (SRC_STATE *)calloc(1,0x50);
    if (_channels_local == (SRC_STATE *)0x0) {
      *error = SRC_ERR_MALLOC_FAILED;
      _channels_local = (SRC_STATE *)0x0;
    }
    else {
      _channels_local->channels = channels;
      _channels_local->mode = SRC_MODE_PROCESS;
      if (_channels_local->channels == 1) {
        _channels_local->vt = &sinc_mono_state_vt;
      }
      else if (_channels_local->channels == 2) {
        _channels_local->vt = &sinc_stereo_state_vt;
      }
      else if (_channels_local->channels == 4) {
        _channels_local->vt = &sinc_quad_state_vt;
      }
      else if (_channels_local->channels == 6) {
        _channels_local->vt = &sinc_hex_state_vt;
      }
      else {
        _channels_local->vt = &sinc_multichan_state_vt;
      }
      pSVar1 = sinc_filter_new(converter_type,_channels_local->channels);
      _channels_local->private_data = pSVar1;
      if (_channels_local->private_data == (void *)0x0) {
        free(_channels_local);
        *error = SRC_ERR_MALLOC_FAILED;
        _channels_local = (SRC_STATE *)0x0;
      }
      else {
        sinc_reset(_channels_local);
        *error = SRC_ERR_NO_ERROR;
      }
    }
  }
  else {
    *error = SRC_ERR_BAD_CHANNEL_COUNT;
    _channels_local = (SRC_STATE *)0x0;
  }
  return _channels_local;
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE SRC_STATE *
sinc_state_new (int converter_type, int channels, SRC_ERROR *error)
{
	assert (converter_type == SRC_SINC_FASTEST ||
		converter_type == SRC_SINC_MEDIUM_QUALITY ||
		converter_type == SRC_SINC_BEST_QUALITY) ;
	assert (channels > 0) ;
	assert (error != NULL) ;

	if (channels > MAX_CHANNELS)
	{
		*error = SRC_ERR_BAD_CHANNEL_COUNT ;
		return NULL ;
	}

	SRC_STATE *state = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!state)
	{
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->channels = channels ;
	state->mode = SRC_MODE_PROCESS ;

	if (state->channels == 1)
		state->vt = &sinc_mono_state_vt ;
	else if (state->channels == 2)
		state->vt = &sinc_stereo_state_vt ;
	else if (state->channels == 4)
		state->vt = &sinc_quad_state_vt ;
	else if (state->channels == 6)
		state->vt = &sinc_hex_state_vt ;
	else
		state->vt = &sinc_multichan_state_vt ;

	state->private_data = sinc_filter_new (converter_type, state->channels) ;
	if (!state->private_data)
	{
		free (state) ;
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	sinc_reset (state) ;

	*error = SRC_ERR_NO_ERROR ;

	return state ;
}